

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

string * __thiscall
leveldb::EscapeString_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Slice *value)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  AppendEscapedStringTo(__return_storage_ptr__,(Slice *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string EscapeString(const Slice& value) {
  std::string r;
  AppendEscapedStringTo(&r, value);
  return r;
}